

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3InitCallback(void *pInit,int argc,char **argv,char **NotUsed)

{
  undefined1 *puVar1;
  u8 uVar2;
  uint uVar3;
  sqlite3 *db;
  byte *pbVar4;
  int iVar5;
  Index *pIndex;
  char *pcVar6;
  sqlite3_stmt *pStmt;
  
  db = *pInit;
  iVar5 = *(int *)((long)pInit + 0x10);
  db->mDbFlags = db->mDbFlags | 0x40;
  if (argv == (char **)0x0) {
    return 0;
  }
  *(int *)((long)pInit + 0x1c) = *(int *)((long)pInit + 0x1c) + 1;
  if (db->mallocFailed != '\0') {
    corruptSchema((InitData *)pInit,argv,(char *)0x0);
    return 1;
  }
  pcVar6 = argv[3];
  if (pcVar6 == (char *)0x0) {
LAB_0017136a:
    pcVar6 = (char *)0x0;
  }
  else {
    pbVar4 = (byte *)argv[4];
    if (pbVar4 == (byte *)0x0) {
      pcVar6 = argv[1];
      if (pcVar6 == (char *)0x0) goto LAB_0017136a;
    }
    else {
      if (((*pbVar4 & 0xdf) == 0x43) && ((pbVar4[1] & 0xdf) == 0x52)) {
        uVar2 = (db->init).iDb;
        (db->init).iDb = (u8)iVar5;
        iVar5 = sqlite3GetUInt32(pcVar6,&(db->init).newTnum);
        if (((iVar5 == 0) ||
            ((*(uint *)((long)pInit + 0x20) < (db->init).newTnum &&
             (*(uint *)((long)pInit + 0x20) != 0)))) && (sqlite3Config.bExtraSchemaChecks != '\0'))
        {
          corruptSchema((InitData *)pInit,argv,"invalid rootpage");
        }
        puVar1 = &(db->init).field_0x6;
        *puVar1 = *puVar1 & 0xfe;
        (db->init).azInit = argv;
        pStmt = (sqlite3_stmt *)0x0;
        sqlite3Prepare(db,argv[4],-1,0,(Vdbe *)0x0,&pStmt,(char **)0x0);
        iVar5 = db->errCode;
        (db->init).iDb = uVar2;
        if ((iVar5 != 0) && (((db->init).field_0x6 & 1) == 0)) {
          if (*(int *)((long)pInit + 0x14) < iVar5) {
            *(int *)((long)pInit + 0x14) = iVar5;
          }
          if (iVar5 != 9) {
            if (iVar5 == 7) {
              sqlite3OomFault(db);
            }
            else if ((char)iVar5 != '\x06') {
              pcVar6 = sqlite3_errmsg(db);
              corruptSchema((InitData *)pInit,argv,pcVar6);
            }
          }
        }
        (db->init).azInit = sqlite3StdType;
        sqlite3_finalize(pStmt);
        return 0;
      }
      pcVar6 = argv[1];
      if (pcVar6 == (char *)0x0 || *pbVar4 != 0) goto LAB_0017136a;
    }
    pIndex = sqlite3FindIndex(db,pcVar6,db->aDb[iVar5].zDbSName);
    if (pIndex == (Index *)0x0) {
      pcVar6 = "orphan index";
    }
    else {
      iVar5 = sqlite3GetUInt32(argv[3],&pIndex->tnum);
      if ((((iVar5 != 0) && (uVar3 = pIndex->tnum, 1 < uVar3)) &&
          (uVar3 <= *(uint *)((long)pInit + 0x20))) &&
         (iVar5 = sqlite3IndexHasDuplicateRootPage(pIndex), iVar5 == 0)) {
        return 0;
      }
      if (sqlite3Config.bExtraSchemaChecks == '\0') {
        return 0;
      }
      pcVar6 = "invalid rootpage";
    }
  }
  corruptSchema((InitData *)pInit,argv,pcVar6);
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3InitCallback(void *pInit, int argc, char **argv, char **NotUsed){
  InitData *pData = (InitData*)pInit;
  sqlite3 *db = pData->db;
  int iDb = pData->iDb;

  assert( argc==5 );
  UNUSED_PARAMETER2(NotUsed, argc);
  assert( sqlite3_mutex_held(db->mutex) );
  db->mDbFlags |= DBFLAG_EncodingFixed;
  if( argv==0 ) return 0;   /* Might happen if EMPTY_RESULT_CALLBACKS are on */
  pData->nInitRow++;
  if( db->mallocFailed ){
    corruptSchema(pData, argv, 0);
    return 1;
  }

  assert( iDb>=0 && iDb<db->nDb );
  if( argv[3]==0 ){
    corruptSchema(pData, argv, 0);
  }else if( argv[4]
         && 'c'==sqlite3UpperToLower[(unsigned char)argv[4][0]]
         && 'r'==sqlite3UpperToLower[(unsigned char)argv[4][1]] ){
    /* Call the parser to process a CREATE TABLE, INDEX or VIEW.
    ** But because db->init.busy is set to 1, no VDBE code is generated
    ** or executed.  All the parser does is build the internal data
    ** structures that describe the table, index, or view.
    **
    ** No other valid SQL statement, other than the variable CREATE statements,
    ** can begin with the letters "C" and "R".  Thus, it is not possible run
    ** any other kind of statement while parsing the schema, even a corrupt
    ** schema.
    */
    int rc;
    u8 saved_iDb = db->init.iDb;
    sqlite3_stmt *pStmt;
    TESTONLY(int rcp);            /* Return code from sqlite3_prepare() */

    assert( db->init.busy );
    db->init.iDb = iDb;
    if( sqlite3GetUInt32(argv[3], &db->init.newTnum)==0
     || (db->init.newTnum>pData->mxPage && pData->mxPage>0)
    ){
      if( sqlite3Config.bExtraSchemaChecks ){
        corruptSchema(pData, argv, "invalid rootpage");
      }
    }
    db->init.orphanTrigger = 0;
    db->init.azInit = (const char**)argv;
    pStmt = 0;
    TESTONLY(rcp = ) sqlite3Prepare(db, argv[4], -1, 0, 0, &pStmt, 0);
    rc = db->errCode;
    assert( (rc&0xFF)==(rcp&0xFF) );
    db->init.iDb = saved_iDb;
    /* assert( saved_iDb==0 || (db->mDbFlags & DBFLAG_Vacuum)!=0 ); */
    if( SQLITE_OK!=rc ){
      if( db->init.orphanTrigger ){
        assert( iDb==1 );
      }else{
        if( rc > pData->rc ) pData->rc = rc;
        if( rc==SQLITE_NOMEM ){
          sqlite3OomFault(db);
        }else if( rc!=SQLITE_INTERRUPT && (rc&0xFF)!=SQLITE_LOCKED ){
          corruptSchema(pData, argv, sqlite3_errmsg(db));
        }
      }
    }
    db->init.azInit = sqlite3StdType; /* Any array of string ptrs will do */
    sqlite3_finalize(pStmt);
  }else if( argv[1]==0 || (argv[4]!=0 && argv[4][0]!=0) ){
    corruptSchema(pData, argv, 0);
  }else{
    /* If the SQL column is blank it means this is an index that
    ** was created to be the PRIMARY KEY or to fulfill a UNIQUE
    ** constraint for a CREATE TABLE.  The index should have already
    ** been created when we processed the CREATE TABLE.  All we have
    ** to do here is record the root page number for that index.
    */
    Index *pIndex;
    pIndex = sqlite3FindIndex(db, argv[1], db->aDb[iDb].zDbSName);
    if( pIndex==0 ){
      corruptSchema(pData, argv, "orphan index");
    }else
    if( sqlite3GetUInt32(argv[3],&pIndex->tnum)==0
     || pIndex->tnum<2
     || pIndex->tnum>pData->mxPage
     || sqlite3IndexHasDuplicateRootPage(pIndex)
    ){
      if( sqlite3Config.bExtraSchemaChecks ){
        corruptSchema(pData, argv, "invalid rootpage");
      }
    }
  }
  return 0;
}